

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

int nn_req_csend(nn_sockbase *self,nn_msg *msg)

{
  nn_msg *src;
  int iVar1;
  size_t sVar2;
  uint8_t *buf;
  nn_msg *dst;
  nn_msg *pnVar3;
  int iVar4;
  
  *(int *)&self[0x38].sock = *(int *)&self[0x38].sock + 1;
  dst = msg;
  pnVar3 = msg;
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_init(&msg->sphdr,4);
    buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
    nn_putl(buf,*(uint *)&self[0x38].sock | 0x80000000);
    nn_msg_term((nn_msg *)(self + 0x39));
    nn_msg_mv((nn_msg *)(self + 0x39),msg);
    nn_fsm_action((nn_fsm *)(self + 0x32),4);
    return 0;
  }
  nn_req_csend_cold_1();
  iVar1 = *(int *)((long)&pnVar3[9].sphdr.u + 0x18);
  iVar4 = -0x9523dfe;
  if ((1 < iVar1 - 1U) && (iVar1 != 9)) {
    if (iVar1 == 8) {
      src = (nn_msg *)((long)&pnVar3[10].hdrs.u + 0x10);
      nn_msg_mv(dst,src);
      iVar4 = 0;
      nn_msg_init(src,0);
      nn_fsm_action((nn_fsm *)&pnVar3[8].hdrs,5);
    }
    else {
      iVar4 = -0xb;
    }
  }
  return iVar4;
}

Assistant:

int nn_req_csend (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Generate new request ID for the new request and put it into message
        header. The most important bit is set to 1 to indicate that this is
        the bottom of the backtrace stack. */
    ++req->task.id;
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), req->task.id | 0x80000000);

    /*  Store the message so that it can be re-sent if there's no reply. */
    nn_msg_term (&req->task.request);
    nn_msg_mv (&req->task.request, msg);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_SENT);

    return 0;
}